

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

ssh_key * rsa2_new_priv(ssh_keyalg *self,ptrlen pub,ptrlen priv)

{
  _Bool _Var1;
  ssh_keyalg *psVar2;
  RSAKey *rsa;
  ssh_key *sshk;
  BinarySource src [1];
  ssh_keyalg *self_local;
  ptrlen priv_local;
  ptrlen pub_local;
  
  pub_local.len = (size_t)rsa2_new_pub(self,pub);
  if ((ssh_key *)pub_local.len == (ssh_key *)0x0) {
    pub_local.len = 0;
  }
  else {
    BinarySource_INIT__((BinarySource *)&sshk,priv);
    psVar2 = (ssh_keyalg *)BinarySource_get_mp_ssh2((BinarySource *)src[0]._24_8_);
    ((ssh_key *)(pub_local.len + -0x28))->vt = psVar2;
    psVar2 = (ssh_keyalg *)BinarySource_get_mp_ssh2((BinarySource *)src[0]._24_8_);
    ((ssh_key *)(pub_local.len + -0x20))->vt = psVar2;
    psVar2 = (ssh_keyalg *)BinarySource_get_mp_ssh2((BinarySource *)src[0]._24_8_);
    ((ssh_key *)(pub_local.len + -0x18))->vt = psVar2;
    psVar2 = (ssh_keyalg *)BinarySource_get_mp_ssh2((BinarySource *)src[0]._24_8_);
    ((ssh_key *)(pub_local.len + -0x10))->vt = psVar2;
    if ((*(int *)(src[0]._24_8_ + 0x18) != 0) ||
       (_Var1 = rsa_verify((RSAKey *)(pub_local.len + -0x40)), !_Var1)) {
      rsa2_freekey((ssh_key *)pub_local.len);
      pub_local.len = 0;
    }
  }
  return (ssh_key *)pub_local.len;
}

Assistant:

static ssh_key *rsa2_new_priv(const ssh_keyalg *self,
                               ptrlen pub, ptrlen priv)
{
    BinarySource src[1];
    ssh_key *sshk;
    RSAKey *rsa;

    sshk = rsa2_new_pub(self, pub);
    if (!sshk)
        return NULL;

    rsa = container_of(sshk, RSAKey, sshk);
    BinarySource_BARE_INIT_PL(src, priv);
    rsa->private_exponent = get_mp_ssh2(src);
    rsa->p = get_mp_ssh2(src);
    rsa->q = get_mp_ssh2(src);
    rsa->iqmp = get_mp_ssh2(src);

    if (get_err(src) || !rsa_verify(rsa)) {
        rsa2_freekey(&rsa->sshk);
        return NULL;
    }

    return &rsa->sshk;
}